

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  ReflectionSchema *this_00;
  byte bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  LogMessage *other;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (lhs != rhs) {
    uVar8 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar3 = *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar8);
    *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar8) =
         *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar8);
    *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar8) = uVar3;
    iVar7 = this->last_non_weak_field_index_;
    if (-1 < iVar7) {
      lVar10 = -1;
      lVar11 = 0;
      do {
        lVar9 = *(long *)(this->descriptor_ + 0x28);
        if ((((*(byte *)(lVar9 + 1 + lVar11) & 0x10) == 0) ||
            (lVar4 = *(long *)(lVar9 + 0x28 + lVar11), lVar4 == 0)) ||
           ((*(int *)(lVar4 + 4) == 1 && ((*(byte *)(*(long *)(lVar4 + 0x20) + 1) & 2) != 0)))) {
          UnsafeShallowSwapField(this,lhs,rhs,(FieldDescriptor *)(lVar9 + lVar11));
          iVar7 = this->last_non_weak_field_index_;
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0x48;
      } while (lVar10 < iVar7);
    }
    iVar7 = *(int *)(this->descriptor_ + 0x68);
    if (0 < (long)iVar7) {
      lVar10 = 0;
      do {
        lVar11 = *(long *)(this->descriptor_ + 0x30);
        if ((*(int *)(lVar11 + 4 + lVar10) != 1) ||
           ((*(byte *)(*(long *)(lVar11 + 0x20 + lVar10) + 1) & 2) == 0)) {
          SwapOneofField<true>(this,lhs,rhs,(OneofDescriptor *)(lVar11 + lVar10));
        }
        lVar10 = lVar10 + 0x28;
      } while ((long)iVar7 * 0x28 != lVar10);
    }
    this_00 = &this->schema_;
    if ((this->schema_).has_bits_offset_ != -1) {
      uVar5 = internal::ReflectionSchema::HasBitsOffset(this_00);
      if ((this->schema_).has_bits_offset_ == -1) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x975);
        other = internal::LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
        internal::LogFinisher::operator=(&local_69,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
      uVar6 = internal::ReflectionSchema::HasBitsOffset(this_00);
      lVar10 = (long)*(int *)(this->descriptor_ + 4);
      if (0 < lVar10) {
        lVar11 = *(long *)(this->descriptor_ + 0x28);
        lVar9 = 0;
        iVar7 = 0;
        do {
          bVar1 = *(byte *)(lVar11 + 1 + lVar9);
          if (((~bVar1 & 0x60) != 0) &&
             ((((bVar1 & 0x10) == 0 || (lVar4 = *(long *)(lVar11 + 0x28 + lVar9), lVar4 == 0)) ||
              ((*(int *)(lVar4 + 4) == 1 && ((*(byte *)(*(long *)(lVar4 + 0x20) + 1) & 2) != 0))))))
          {
            iVar7 = iVar7 + 1;
          }
          lVar9 = lVar9 + 0x48;
        } while (lVar10 * 0x48 != lVar9);
        if (0 < iVar7) {
          uVar8 = 0;
          do {
            uVar2 = *(undefined4 *)
                     ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar8 * 4 + (ulong)uVar5);
            *(undefined4 *)
             ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar8 * 4 + (ulong)uVar5) =
                 *(undefined4 *)
                  ((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar8 * 4 + (ulong)uVar6);
            *(undefined4 *)
             ((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar8 * 4 + (ulong)uVar6) = uVar2;
            uVar8 = uVar8 + 1;
          } while (iVar7 + 0x1fU >> 5 != uVar8);
        }
      }
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      internal::ExtensionSet::InternalSwap
                ((ExtensionSet *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                 (ExtensionSet *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6))
      ;
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsFieldStripped(field)) continue;
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField<true>(lhs, rhs, oneof);
    }
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32* lhs_has_bits = MutableHasBits(lhs);
    uint32* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}